

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::jsonToHeap
          (Interpreter *this,unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *v
          ,bool *filled,Value *attach)

{
  bool bVar1;
  Type TVar2;
  pointer pJVar3;
  Interpreter *pIVar4;
  reference ppHVar5;
  HeapThunk *this_00;
  mapped_type *ppHVar6;
  bool *in_RCX;
  unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *in_RDX;
  Interpreter *in_RSI;
  Interpreter *in_RDI;
  Value VVar7;
  HeapThunk *thunk;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>
  *pair;
  iterator __end4;
  iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
  *__range4;
  HeapComprehensionObject *obj;
  size_t i;
  HeapArray *arr;
  UString *in_stack_fffffffffffffd68;
  Interpreter *in_stack_fffffffffffffd70;
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_stack_fffffffffffffd78;
  Interpreter *in_stack_fffffffffffffd80;
  UString *name;
  string *in_stack_fffffffffffffda8;
  Allocator *this_01;
  AST *this_02;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  int *in_stack_fffffffffffffdd8;
  reference in_stack_fffffffffffffde0;
  Identifier **in_stack_fffffffffffffde8;
  Interpreter *in_stack_fffffffffffffdf0;
  Interpreter *this_03;
  _Self local_178;
  _Self local_170;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
  *local_168;
  undefined8 local_160;
  undefined8 local_158;
  UString *pUStack_150;
  undefined8 local_148;
  UString *pUStack_140;
  undefined8 local_138;
  UString *pUStack_130;
  Allocator local_128;
  undefined4 local_dc;
  undefined8 local_d8;
  HeapThunk *local_d0;
  Interpreter *local_c8;
  long local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  Type local_a0;
  undefined4 uStack_9c;
  anon_union_8_3_4e909c26_for_v local_98;
  undefined4 uStack_8c;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  Type local_30;
  undefined4 uStack_2c;
  Value *in_stack_ffffffffffffffd8;
  
  pJVar3 = std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::operator->
                     ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                      0x2f3464);
  switch(pJVar3->kind) {
  case ARRAY:
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = 0;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              *)0x2f36a5);
    VVar7 = makeArray(in_stack_fffffffffffffd70,
                      (vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                       *)in_stack_fffffffffffffd68);
    local_98 = VVar7.v;
    local_a0 = VVar7.t;
    *(ulong *)in_RCX = CONCAT44(uStack_9c,local_a0);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = local_98;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::~vector((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               *)in_stack_fffffffffffffd80);
    *(undefined1 *)
     &(in_RDX->_M_t).super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
      ._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
      super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl = 1;
    local_c0 = *(long *)(in_RCX + 8);
    local_c8 = (Interpreter *)0x0;
    while( true ) {
      this_03 = local_c8;
      pJVar3 = std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::operator->
                         ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                          0x2f375d);
      pIVar4 = (Interpreter *)
               std::
               vector<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
               ::size(&pJVar3->elements);
      if (pIVar4 <= this_03) break;
      local_d8 = 0;
      local_dc = 0;
      local_128.allocated.
      super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
      _M_node._M_size = 0;
      local_d0 = (anonymous_namespace)::Interpreter::
                 makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                           (this_03,in_stack_fffffffffffffde8,(void **)in_stack_fffffffffffffde0,
                            (int *)(local_c0 + 0x10),
                            (void **)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)in_stack_fffffffffffffd70,(value_type *)in_stack_fffffffffffffd68);
      pJVar3 = std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::operator->
                         ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                          0x2f3807);
      in_stack_fffffffffffffde0 =
           std::
           vector<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
           ::operator[](&pJVar3->elements,(size_type)local_c8);
      ppHVar5 = std::
                vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                              *)(local_c0 + 0x10),(size_type)local_c8);
      in_stack_fffffffffffffde8 = (Identifier **)&((*ppHVar5)->super_HeapEntity).field_0xa;
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::operator[]((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    *)(local_c0 + 0x10),(size_type)local_c8);
      jsonToHeap(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      local_c8 = (Interpreter *)((long)&(local_c8->heap).gcTuneMinObjects + 1);
    }
    break;
  case BOOL:
    pJVar3 = std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::operator->
                       ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                        0x2f356c);
    VVar7 = makeBoolean(in_RDI,pJVar3->number != 0.0);
    *(ulong *)in_RCX = CONCAT44(uStack_6c,VVar7.t);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = VVar7.v;
    *(undefined1 *)
     &(in_RDX->_M_t).super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
      ._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
      super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl = 1;
    break;
  case NULL_KIND:
    VVar7 = makeNull(in_RDI);
    *(ulong *)in_RCX = CONCAT44(uStack_8c,VVar7.t);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = VVar7.v;
    *(undefined1 *)
     &(in_RDX->_M_t).super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
      ._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
      super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl = 1;
    break;
  case NUMBER:
    pJVar3 = std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::operator->
                       ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                        0x2f35de);
    VVar7 = makeNumber(in_RDI,pJVar3->number);
    *(ulong *)in_RCX = CONCAT44(uStack_7c,VVar7.t);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = VVar7.v;
    *(undefined1 *)
     &(in_RDX->_M_t).super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
      ._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
      super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl = 1;
    break;
  case OBJECT:
    name = (UString *)0x0;
    local_128.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    local_128.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_128.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_128.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)0x0;
    local_128.internedIdentifiers._M_t._M_impl._0_8_ = 0;
    local_128.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_128.internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    this_01 = &local_128;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)0x2f38f8);
    this_02 = in_RDI->jsonObjVar;
    local_138 = 0;
    local_148 = 0;
    local_158 = 0;
    pUStack_150 = name;
    pUStack_140 = name;
    pUStack_130 = name;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
           *)0x2f3947);
    VVar7 = (anonymous_namespace)::Interpreter::
            makeObject<jsonnet::internal::(anonymous_namespace)::HeapComprehensionObject,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,jsonnet::internal::AST_const*,jsonnet::internal::Identifier_const*,std::map<jsonnet::internal::Identifier_const*,jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::less<jsonnet::internal::Identifier_const*>,std::allocator<std::pair<jsonnet::internal::Identifier_const*const,jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>>
                      (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                       (AST *)in_stack_fffffffffffffd70,(Identifier *)in_stack_fffffffffffffd68,
                       (map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                        *)0x2f3968);
    local_128.allocated.
    super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)VVar7.v;
    TVar2 = VVar7.t;
    *(ulong *)in_RCX =
         CONCAT44(local_128.allocated.
                  super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next._4_4_,TVar2);
    *(_List_node_base **)(in_RCX + 8) =
         local_128.allocated.
         super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
         _M_impl._M_node.super__List_node_base._M_prev;
    local_128.allocated.
    super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
    _M_node.super__List_node_base._M_next._0_4_ = TVar2;
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            *)0x2f39b7);
    std::
    map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
    ::~map((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
            *)0x2f39c4);
    *(undefined1 *)
     &(in_RDX->_M_t).super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
      ._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
      super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl = 1;
    local_160 = *(undefined8 *)(in_RCX + 8);
    pJVar3 = std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::operator->
                       ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)
                        0x2f39f0);
    local_168 = &pJVar3->fields;
    local_170._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
                  *)in_stack_fffffffffffffd68);
    local_178._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>_>
                *)in_stack_fffffffffffffd68);
    while (bVar1 = std::operator!=(&local_170,&local_178), bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
                   *)0x2f3a51);
      this_00 = (anonymous_namespace)::Interpreter::
                makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                          (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                           (void **)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                           (void **)CONCAT44(TVar2,in_stack_fffffffffffffdd0));
      decode_utf8((string *)this_01);
      Allocator::makeIdentifier(this_01,name);
      ppHVar6 = std::
                map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                ::operator[]((map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                              *)this_02,(key_type *)this_01);
      *ppHVar6 = this_00;
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 this_00);
      jsonToHeap(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
                    *)this_00);
    }
    break;
  case STRING:
    std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>::operator->
              ((unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_> *)0x2f349d);
    decode_utf8(in_stack_fffffffffffffda8);
    VVar7 = makeString(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    local_30 = VVar7.t;
    *(ulong *)in_RCX = CONCAT44(uStack_2c,local_30);
    *(anon_union_8_3_4e909c26_for_v *)(in_RCX + 8) = VVar7.v;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffd70);
    *(undefined1 *)
     &(in_RDX->_M_t).super___uniq_ptr_impl<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>
      ._M_t.super__Tuple_impl<0UL,_JsonnetJsonValue_*,_std::default_delete<JsonnetJsonValue>_>.
      super__Head_base<0UL,_JsonnetJsonValue_*,_false>._M_head_impl = 1;
  }
  return;
}

Assistant:

void jsonToHeap(const std::unique_ptr<JsonnetJsonValue> &v, bool &filled, Value &attach)
    {
        // In order to not anger the garbage collector, assign to attach immediately after
        // making the heap object.
        switch (v->kind) {
            case JsonnetJsonValue::STRING:
                attach = makeString(decode_utf8(v->string));
                filled = true;
                break;

            case JsonnetJsonValue::BOOL:
                attach = makeBoolean(v->number != 0.0);
                filled = true;
                break;

            case JsonnetJsonValue::NUMBER:
                attach = makeNumber(v->number);
                filled = true;
                break;

            case JsonnetJsonValue::NULL_KIND:
                attach = makeNull();
                filled = true;
                break;

            case JsonnetJsonValue::ARRAY: {
                attach = makeArray(std::vector<HeapThunk *>{});
                filled = true;
                auto *arr = static_cast<HeapArray *>(attach.v.h);
                for (size_t i = 0; i < v->elements.size(); ++i) {
                    arr->elements.push_back(
                        makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr));
                    jsonToHeap(v->elements[i], arr->elements[i]->filled, arr->elements[i]->content);
                }
            } break;

            case JsonnetJsonValue::OBJECT: {
                attach = makeObject<HeapComprehensionObject>(
                    BindingFrame{}, jsonObjVar, idJsonObjVar, BindingFrame{});
                filled = true;
                auto *obj = static_cast<HeapComprehensionObject *>(attach.v.h);
                for (const auto &pair : v->fields) {
                    auto *thunk = makeHeap<HeapThunk>(idJsonObjVar, nullptr, 0, nullptr);
                    obj->compValues[alloc->makeIdentifier(decode_utf8(pair.first))] = thunk;
                    jsonToHeap(pair.second, thunk->filled, thunk->content);
                }
            } break;
        }
    }